

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O1

int dog_nutrition(monst *mtmp,obj *obj)

{
  ushort uVar1;
  long lVar2;
  unsigned_short *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (obj->oclass == '\f') {
    iVar4 = obj->quan;
    iVar6 = 1;
    if (-4000 < iVar4) {
      iVar6 = iVar4 / 2000 + 1;
    }
    mtmp->meating = iVar6;
    iVar6 = 0;
    if (0 < iVar4 / 0x14) {
      iVar6 = iVar4 / 0x14;
    }
  }
  else if (obj->oclass == '\a') {
    lVar2 = (long)obj->otyp;
    if (lVar2 == 0x10e) {
      puVar3 = &mons[obj->corpsenm].cnutrit;
      iVar4 = (mons[obj->corpsenm].cwt >> 6) + 3;
    }
    else {
      puVar3 = &objects[lVar2].oc_nutrition;
      iVar4 = (int)objects[lVar2].oc_delay;
    }
    mtmp->meating = iVar4;
    uVar1 = *puVar3;
    uVar5 = (uint)uVar1;
    switch(mtmp->data->msize) {
    case '\0':
      iVar6 = uVar5 << 3;
      break;
    case '\x01':
      uVar5 = uVar5 * 2;
    case '\x04':
      iVar6 = uVar5 * 3;
      break;
    default:
      iVar6 = (uint)uVar1 + (uint)uVar1 * 4;
      break;
    case '\x03':
      iVar6 = uVar5 << 2;
      break;
    case '\a':
      iVar6 = uVar5 * 2;
    }
    if (obj->oeaten != 0) {
      iVar4 = eaten_stat(mtmp->meating,obj);
      mtmp->meating = iVar4;
      iVar4 = eaten_stat(iVar6,obj);
      return iVar4;
    }
  }
  else {
    mtmp->meating = obj->owt / 0x14 + 1;
    iVar6 = (uint)objects[obj->otyp].oc_nutrition + (uint)objects[obj->otyp].oc_nutrition * 4;
  }
  return iVar6;
}

Assistant:

int dog_nutrition(struct monst *mtmp, struct obj *obj)
{
	int nutrit;

	/*
	 * It is arbitrary that the pet takes the same length of time to eat
	 * as a human, but gets more nutritional value.
	 */
	if (obj->oclass == FOOD_CLASS) {
	    if (obj->otyp == CORPSE) {
		mtmp->meating = 3 + (mons[obj->corpsenm].cwt >> 6);
		nutrit = mons[obj->corpsenm].cnutrit;
	    } else {
		mtmp->meating = objects[obj->otyp].oc_delay;
		nutrit = objects[obj->otyp].oc_nutrition;
	    }
	    switch(mtmp->data->msize) {
		case MZ_TINY: nutrit *= 8; break;
		case MZ_SMALL: nutrit *= 6; break;
		default:
		case MZ_MEDIUM: nutrit *= 5; break;
		case MZ_LARGE: nutrit *= 4; break;
		case MZ_HUGE: nutrit *= 3; break;
		case MZ_GIGANTIC: nutrit *= 2; break;
	    }
	    if (obj->oeaten) {
		mtmp->meating = eaten_stat(mtmp->meating, obj);
		nutrit = eaten_stat(nutrit, obj);
	    }
	} else if (obj->oclass == COIN_CLASS) {
	    mtmp->meating = (int)(obj->quan/2000) + 1;
	    if (mtmp->meating < 0) mtmp->meating = 1;
	    nutrit = (int)(obj->quan/20);
	    if (nutrit < 0) nutrit = 0;
	} else {
	    /* Unusual pet such as gelatinous cube eating odd stuff.
	     * meating made consistent with wild monsters in mon.c.
	     * nutrit made consistent with polymorphed player nutrit in
	     * eat.c.  (This also applies to pets eating gold.)
	     */
	    mtmp->meating = obj->owt/20 + 1;
	    nutrit = 5*objects[obj->otyp].oc_nutrition;
	}
	return nutrit;
}